

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O1

wchar_t borg_calculate_defense_effectiveness(wchar_t what,wchar_t p1)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  loc_conflict grid2;
  loc_conflict grid1_02;
  loc_conflict grid1_03;
  loc_conflict grid1_04;
  loc_conflict grid1_05;
  loc_conflict grid1_06;
  monster_race *pmVar5;
  borg_kill *pbVar6;
  borg_item_conflict *pbVar7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  byte bVar13;
  char cVar14;
  int iVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  ulong uVar19;
  int *piVar20;
  char *pcVar21;
  short sVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  uint *puVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  char cVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  keycode_t k;
  char *fmt;
  uint uVar33;
  uint uVar34;
  bool bVar35;
  borg_grid *pbVar36;
  char cVar37;
  ulong uVar38;
  bool bVar39;
  wchar_t b_kill_count [255];
  wchar_t b_danger [255];
  ulong local_c68;
  _Bool *local_c60;
  wchar_t local_c54;
  int local_c50;
  int local_c4c;
  uint local_c38 [256];
  wchar_t local_838 [256];
  wchar_t local_438 [258];
  
  _Var10 = borg.temp.res_fire;
  iVar15 = borg.c.y;
  iVar30 = borg.c.x;
  puVar25 = &switchD_00210afa::switchdataD_00284c40;
  switch(what) {
  case L'\0':
    if (borg.temp.bless) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    if (((borg_grids[borg.c.y][borg.c.x].info & 2) == 0) && (borg.trait[0x1a] == 0)) {
      return L'\0';
    }
    _Var10 = borg_spell_okay_fail(BLESS,L'\x19');
    if ((((((!_Var10) && (_Var10 = borg_equips_item(act_blessing,true), !_Var10)) &&
          (_Var10 = borg_equips_item(act_blessing2,true), !_Var10)) &&
         ((_Var10 = borg_equips_item(act_blessing3,true), !_Var10 &&
          (wVar17 = borg_slot(L'\x19',sv_scroll_blessing), wVar17 == L'\xffffffff')))) &&
        (wVar17 = borg_slot(L'\x19',sv_scroll_holy_chant), wVar17 == L'\xffffffff')) &&
       (wVar17 = borg_slot(L'\x19',sv_scroll_holy_prayer), wVar17 == L'\xffffffff')) {
      return L'\0';
    }
    bVar13 = 1;
    if (1 < borg_kills_nxt) {
      lVar28 = 1;
      lVar32 = 0x1d8;
      bVar13 = 0;
      do {
        if (((*(short *)(borg_kills->spell + lVar32 + -0x19) != 0) &&
            (borg_t + -5 <= (int)*(short *)((long)&borg_kills->when + lVar32))) &&
           (grid1.y = borg.c.y, grid1.x = borg.c.x,
           wVar17 = distance(grid1,*(loc_conflict *)(borg_kills->spell + lVar32 + -0xd)),
           wVar17 < L'\x04')) {
          bVar13 = 1;
        }
        lVar28 = lVar28 + 1;
        lVar32 = lVar32 + 0x1d8;
      } while (lVar28 < borg_kills_nxt);
      bVar13 = bVar13 ^ 1;
    }
    if ((int)avoidance / 0xc < p1) {
      bVar35 = (bool)(p1 < L'\x01' | bVar13);
    }
    else {
      bVar35 = (bool)(p1 < L'\x01' | bVar13 | 0xf < borg.trait[0x23]);
    }
    if (bVar35) {
      return L'\0';
    }
    if ((int)(short)(avoidance - (avoidance >> 0xf)) >> 1 <= p1) {
      return L'\0';
    }
    wVar17 = L'\x01';
    if (borg_simulate != false) {
      return L'\x01';
    }
    borg_note("# Attempting to cast Bless");
    borg.no_rest_prep = 11000;
    _Var10 = borg_spell(BLESS);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_activate_item(act_blessing);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_activate_item(act_blessing2);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_activate_item(act_blessing3);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_read_scroll(sv_scroll_blessing);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_read_scroll(sv_scroll_holy_chant);
    if (_Var10) {
      return L'\x01';
    }
    _Var10 = borg_read_scroll(sv_scroll_holy_prayer);
    goto LAB_00212ea2;
  case L'\x01':
    if (((!borg.temp.fast) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(HASTE_SELF,wVar17);
      _Var11 = borg_equips_staff_fail(sv_staff_speed);
      _Var12 = borg_equips_rod(sv_rod_speed);
      wVar18 = borg_slot(L'\x1a',sv_potion_speed);
      if ((((wVar18 < L'\0') && (!_Var11)) && (!_Var12)) &&
         (((!_Var10 && (_Var9 = borg_equips_item(act_haste,true), !_Var9)) &&
          ((_Var9 = borg_equips_item(act_haste1,true), !_Var9 &&
           (_Var9 = borg_equips_item(act_haste2,true), !_Var9)))))) {
        return L'\0';
      }
      if ((((_Var12 || _Var10) || _Var11) || (_Var10 = borg_equips_item(act_haste,true), _Var10)) ||
         ((_Var10 = borg_equips_item(act_haste1,true), _Var10 ||
          (_Var10 = borg_equips_item(act_haste2,true), _Var10)))) {
        bVar35 = true;
      }
      else {
        bVar35 = false;
      }
      borg.temp.fast = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      wVar16 = borg_fighting_unique;
      borg.temp.fast = false;
      if (scaryguy_on_level == true) {
        wVar18 = (wVar18 * 3) / 10;
      }
      if ((bool)(borg_fighting_unique != L'\0' & bVar35)) {
        wVar18 = (wVar18 * 7) / 10;
      }
      if ((borg_fighting_unique != L'\0' & borg_fighting_summoner) == 1) {
        wVar18 = (wVar18 * 7) / 10;
      }
      iVar30 = borg.trait[0x69];
      if (L'\t' < borg_fighting_unique && iVar30 == 99) {
        wVar18 = (wVar18 * 6) / 10;
      }
      if (borg_fighting_unique != L'\0') {
        pcVar21 = r_info[unique_on_level].name;
        iVar15 = strcmp(pcVar21,"Bullroarer the Hobbit");
        if ((((iVar15 == 0) || (iVar15 = strcmp(pcVar21,"Mughash the Kobold Lord"), iVar15 == 0)) ||
            (iVar15 = strcmp(pcVar21,"Wormtongue, Agent of Saruman"), iVar15 == 0)) ||
           (((iVar15 = strcmp(pcVar21,"Lagduf, the Snaga"), iVar15 == 0 ||
             (iVar15 = strcmp(pcVar21,"Brodda, the Easterling"), iVar15 == 0)) ||
            (iVar15 = strcmp(pcVar21,"Orfax, Son of Boldor"), iVar15 == 0)))) {
          wVar18 = (wVar18 * 6) / 10;
        }
      }
      wVar24 = wVar18 / 2;
      if (wVar16 < L'\n') {
        wVar24 = wVar18;
      }
      if (iVar30 != 100) {
        wVar24 = wVar18;
      }
      wVar18 = L'✏';
      if (wVar16 != L'\0') {
        wVar18 = wVar24;
      }
      if (iVar30 < 0x61) {
        wVar18 = wVar24;
      }
      if (bVar35) {
        wVar18 = wVar24;
      }
      wVar24 = p1 - wVar18;
      if (wVar24 == L'\0' || p1 < wVar18) {
        return L'\0';
      }
      if (wVar16 == L'\0') {
        wVar23 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar23 = (avoidance * 2) / 3;
      }
      if ((wVar23 < wVar18) || (!(bool)(bVar35 & (int)avoidance / 5 < p1))) {
        if (wVar16 == L'\0') {
          wVar16 = (wchar_t)(avoidance / 3);
        }
        else {
          wVar16 = (avoidance * 2) / 3;
        }
        if (wVar16 < wVar18) {
          return L'\0';
        }
        if (p1 <= (int)avoidance / 7) {
          return L'\0';
        }
      }
      if (borg_simulate == true) {
        return wVar24;
      }
      borg_note("# Attempting to cast Speed");
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      _Var10 = borg_zap_rod(sv_rod_speed);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_activate_item(act_haste);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_activate_item(act_haste1);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_activate_item(act_haste2);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_use_staff(sv_staff_speed);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_quaff_potion(sv_potion_speed);
      if (_Var10) {
        return wVar24;
      }
      _Var10 = borg_spell_fail(HASTE_SELF,wVar17);
      if (!_Var10) {
        return L'\0';
      }
      return wVar24;
    }
    break;
  case L'\x02':
    iVar30 = borg.trait[0x4e];
    iVar15 = borg.trait[0x56];
    if ((((iVar30 == 0 || iVar15 == 0) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(GRIM_PURPOSE,wVar17);
      if (!_Var10) {
        return L'\0';
      }
      wVar17 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar20 = borg.trait;
      borg.trait[0x4e] = 1;
      piVar20[0x56] = 1;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar20 = borg.trait;
      borg.trait[0x4e] = (uint)(iVar30 != 0);
      piVar20[0x56] = (uint)(iVar15 != 0);
      iVar30 = wVar17 - wVar18;
      if (iVar30 == 0 || wVar17 < wVar18) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar16 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar16 = (avoidance * 2) / 3;
      }
      if (wVar16 < wVar18) {
        return L'\0';
      }
      if (wVar17 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate != true) {
        borg_note("# Attempting to cast Grim Purpose");
        _Var10 = borg_spell(GRIM_PURPOSE);
        if (_Var10) {
          borg.no_rest_prep = 13000;
        }
      }
LAB_00215e18:
      return iVar30 + L'\x02';
    }
    break;
  case L'\x03':
    if (((((!borg.temp.res_fire) || (!borg.temp.res_acid)) ||
         ((!borg.temp.res_pois || ((!borg.temp.res_elec || (!borg.temp.res_cold)))))) &&
        (borg.trait[0x70] == 0)) && ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      _Var10 = borg_equips_item(act_resist_all,true);
      if ((!_Var10) && (_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10)) {
        return L'\0';
      }
      wVar16 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var8 = borg.temp.res_pois;
      _Var9 = borg.temp.res_elec;
      _Var12 = borg.temp.res_acid;
      _Var11 = borg.temp.res_cold;
      _Var10 = borg.temp.res_fire;
      borg.temp.res_fire = true;
      borg.temp.res_cold = true;
      borg.temp.res_acid = true;
      borg.temp.res_elec = true;
      borg.temp.res_pois = true;
      wVar17 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar18 = borg_fighting_unique;
      borg.temp.res_fire = _Var10;
      borg.temp.res_cold = _Var11;
      borg.temp.res_acid = _Var12;
      borg.temp.res_elec = _Var9;
      borg.temp.res_pois = _Var8;
      if ((borg_fighting_unique != L'\0') &&
         (iVar30 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar30 == 0)) {
        wVar17 = (wVar17 << 3) / 10;
      }
      if (0x2c < borg.trait[0x23]) {
        wVar17 = (wVar17 << 3) / 10;
      }
      iVar30 = wVar16 - wVar17;
      if (iVar30 == 0 || wVar16 < wVar17) {
        return L'\0';
      }
      if (wVar18 == L'\0') {
        wVar18 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar18 = (avoidance * 2) / 3;
      }
      if (wVar18 < wVar17) {
        return L'\0';
      }
      if (wVar16 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate != true) {
        borg_note("# Attempting to cast FECAP");
        _Var10 = borg_activate_item(act_resist_all);
        if ((_Var10) || (_Var10 = borg_activate_item(act_rage_bless_resist), _Var10)) {
          borg.no_rest_prep = 21000;
        }
      }
      goto LAB_00215e18;
    }
    break;
  case L'\x04':
    if (((!borg.temp.res_fire) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var11 = borg_spell_okay_fail(RESISTANCE,wVar17);
      if ((((!_Var11) && (_Var11 = borg_equips_item(act_resist_all,true), !_Var11)) &&
          (_Var11 = borg_equips_item(act_resist_fire,true), !_Var11)) &&
         (((_Var11 = borg_equips_item(act_rage_bless_resist,true), !_Var11 &&
           (_Var11 = borg_equips_ring(sv_ring_flames), !_Var11)) &&
          ((_Var11 = borg_equips_item(act_ring_flames,true), !_Var11 &&
           (wVar18 = borg_slot(L'\x1a',sv_potion_resist_heat), wVar18 == L'\xffffffff')))))) {
        return L'\0';
      }
      wVar24 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.res_fire = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar16 = borg_fighting_unique;
      borg.temp.res_fire = _Var10;
      if ((borg_fighting_unique != L'\0') &&
         (iVar30 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar30 == 0)) {
        wVar18 = (wVar18 << 3) / 10;
      }
      wVar23 = wVar24 - wVar18;
      if (wVar23 == L'\0' || wVar24 < wVar18) {
        return L'\0';
      }
      if (wVar16 == L'\0') {
        wVar16 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar16 = (avoidance * 2) / 3;
      }
      if (wVar16 < wVar18) {
        return L'\0';
      }
      if (wVar24 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar23;
      }
      borg_note("# Attempting to cast RFire");
      _Var10 = borg_activate_ring(sv_ring_flames);
      if ((_Var10) || (_Var10 = borg_activate_item(act_ring_flames), _Var10)) {
        borg_keypress(0x2a);
        borg_keypress(0x35);
        return wVar23;
      }
      _Var10 = borg_activate_item(act_resist_all);
      if ((((!_Var10) && (_Var10 = borg_activate_item(act_resist_fire), !_Var10)) &&
          (_Var10 = borg_activate_item(act_rage_bless_resist), !_Var10)) &&
         ((_Var10 = borg_spell_fail(RESISTANCE,wVar17), !_Var10 &&
          (_Var10 = borg_quaff_potion(sv_potion_resist_heat), !_Var10)))) {
        return wVar23;
      }
      borg.no_rest_prep = 21000;
      return wVar23;
    }
    break;
  case L'\x05':
    if (((!borg.temp.res_cold) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(RESISTANCE,wVar17);
      if ((((!_Var10) && (_Var10 = borg_equips_item(act_resist_all,true), !_Var10)) &&
          (_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10)) &&
         (((_Var10 = borg_equips_item(act_resist_cold,true), !_Var10 &&
           (_Var10 = borg_equips_ring(sv_ring_ice), !_Var10)) &&
          ((_Var10 = borg_equips_item(act_ring_ice,true), !_Var10 &&
           (wVar18 = borg_slot(L'\x1a',sv_potion_resist_cold), wVar18 == L'\xffffffff')))))) {
        return L'\0';
      }
      wVar24 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var10 = borg.temp.res_cold;
      borg.temp.res_cold = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar16 = borg_fighting_unique;
      borg.temp.res_cold = _Var10;
      if ((borg_fighting_unique != L'\0') &&
         (iVar30 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar30 == 0)) {
        wVar18 = (wVar18 << 3) / 10;
      }
      wVar23 = wVar24 - wVar18;
      if (wVar23 == L'\0' || wVar24 < wVar18) {
        return L'\0';
      }
      if (wVar16 == L'\0') {
        wVar16 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar16 = (avoidance * 2) / 3;
      }
      if (wVar16 < wVar18) {
        return L'\0';
      }
      if (wVar24 <= (int)avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar23;
      }
      borg_note("# Attempting to cast RCold");
      _Var10 = borg_activate_ring(sv_ring_ice);
      if ((_Var10) || (_Var10 = borg_activate_item(act_ring_ice), _Var10)) {
        borg_keypress(0x2a);
        borg_keypress(0x35);
        return wVar23;
      }
      _Var10 = borg_activate_item(act_resist_all);
      if ((((!_Var10) && (_Var10 = borg_activate_item(act_rage_bless_resist), !_Var10)) &&
          (_Var10 = borg_activate_item(act_resist_cold), !_Var10)) &&
         ((_Var10 = borg_spell_fail(RESISTANCE,wVar17), !_Var10 &&
          (_Var10 = borg_quaff_potion(sv_potion_resist_cold), !_Var10)))) {
        return wVar23;
      }
      borg.no_rest_prep = 21000;
      return wVar23;
    }
    break;
  case L'\x06':
    if (((!borg.temp.res_acid) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(RESISTANCE,wVar17);
      if ((((!_Var10) && (_Var10 = borg_equips_item(act_resist_acid,true), !_Var10)) &&
          (_Var10 = borg_equips_item(act_resist_all,true), !_Var10)) &&
         ((_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10 &&
          (_Var10 = borg_equips_ring(sv_ring_acid), !_Var10)))) {
        return L'\0';
      }
      wVar17 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var10 = borg.temp.res_acid;
      borg.temp.res_acid = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar16 = wVar17 - wVar18;
      if (wVar16 == L'\0' || wVar17 < wVar18) {
        borg.temp.res_acid = _Var10;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar24 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar24 = (avoidance * 2) / 3;
      }
      if (wVar24 < wVar18) {
        borg.temp.res_acid = _Var10;
        return L'\0';
      }
      if (wVar17 <= (int)avoidance / 7) {
        borg.temp.res_acid = _Var10;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg.temp.res_acid = _Var10;
        return wVar16;
      }
      borg.temp.res_acid = _Var10;
      borg_note("# Attempting to cast RAcid");
      _Var10 = borg_spell(RESISTANCE);
      if (_Var10) {
        return wVar16;
      }
      _Var10 = borg_activate_ring(sv_ring_acid);
      if ((_Var10) || (_Var10 = borg_activate_item(act_ring_acid), _Var10)) {
LAB_00215907:
        borg_keypress(0x2a);
        borg_keypress(0x35);
        return wVar16;
      }
      piVar20 = &act_resist_acid;
LAB_002162d2:
      _Var10 = borg_activate_item(*piVar20);
      if (((!_Var10) && (_Var10 = borg_activate_item(act_resist_all), !_Var10)) &&
         (_Var10 = borg_activate_item(act_rage_bless_resist), !_Var10)) {
        return wVar16;
      }
      borg.no_rest_prep = 21000;
      return wVar16;
    }
    break;
  case L'\a':
    if ((((!borg.temp.res_elec) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(RESISTANCE,wVar17);
      if (((!_Var10) && (_Var10 = borg_equips_item(act_resist_elec,true), !_Var10)) &&
         ((_Var10 = borg_equips_item(act_resist_all,true), !_Var10 &&
          (((_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10 &&
            (_Var10 = borg_equips_ring(sv_ring_lightning), !_Var10)) &&
           (_Var10 = borg_equips_item(act_ring_lightning,true), !_Var10)))))) {
        return L'\0';
      }
      wVar17 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var10 = borg.temp.res_elec;
      borg.temp.res_elec = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar16 = wVar17 - wVar18;
      if (wVar16 == L'\0' || wVar17 < wVar18) {
        borg.temp.res_elec = _Var10;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar24 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar24 = (avoidance * 2) / 3;
      }
      if (wVar24 < wVar18) {
        borg.temp.res_elec = _Var10;
        return L'\0';
      }
      if (wVar17 <= (int)avoidance / 7) {
        borg.temp.res_elec = _Var10;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg.temp.res_elec = _Var10;
        return wVar16;
      }
      borg.temp.res_elec = _Var10;
      borg_note("# Attempting to cast RAcid");
      _Var10 = borg_spell(RESISTANCE);
      if (_Var10) {
        return wVar16;
      }
      _Var10 = borg_activate_ring(sv_ring_lightning);
      if ((_Var10) || (_Var10 = borg_activate_item(act_ring_lightning), _Var10)) goto LAB_00215907;
      piVar20 = &act_resist_elec;
      goto LAB_002162d2;
    }
    break;
  case L'\b':
    if (((!borg.temp.res_pois) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x0f', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'#';
        }
      }
      _Var10 = borg_spell_okay_fail(RESIST_POISON,wVar17);
      if ((((!_Var10) && (_Var10 = borg_equips_item(act_resist_pois,true), !_Var10)) &&
          (_Var10 = borg_equips_item(act_resist_all,true), !_Var10)) &&
         ((_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10 &&
          (wVar18 = borg_slot(L'\x1a',sv_potion_resist_pois), wVar18 == L'\xffffffff')))) {
        return L'\0';
      }
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var10 = borg.temp.res_pois;
      borg.temp.res_pois = true;
      wVar16 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar24 = wVar18 - wVar16;
      if (wVar24 == L'\0' || wVar18 < wVar16) {
        borg.temp.res_pois = _Var10;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar23 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar23 = (avoidance * 2) / 3;
      }
      if (wVar23 < wVar16) {
        borg.temp.res_pois = _Var10;
        return L'\0';
      }
      if (wVar18 <= (int)avoidance / 7) {
        borg.temp.res_pois = _Var10;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg.temp.res_pois = _Var10;
        return wVar24;
      }
      borg.temp.res_pois = _Var10;
      borg_note("# Attempting to cast RPois");
      _Var10 = borg_spell_fail(RESIST_POISON,wVar17);
      if (((!_Var10) && (_Var10 = borg_activate_item(act_resist_pois), !_Var10)) &&
         ((_Var10 = borg_activate_item(act_resist_all), !_Var10 &&
          ((_Var10 = borg_activate_item(act_rage_bless_resist), !_Var10 &&
           (_Var10 = borg_quaff_potion(sv_potion_resist_pois), !_Var10)))))) {
        return wVar24;
      }
      borg.no_rest_prep = 21000;
      return wVar24;
    }
    break;
  case L'\t':
    if (borg.temp.prot_from_evil) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    wVar18 = (wchar_t)avoidance;
    wVar17 = L'\x06';
    if ((p1 <= wVar18) && (wVar17 = L'\x14', p1 <= (wVar18 * 2) / 3)) {
      wVar17 = L'\x19';
      if (p1 < wVar18 / 3) {
        wVar17 = L'#';
      }
    }
    pbVar36 = borg_grids[borg.c.y];
    lVar28 = (long)borg.c.x;
    _Var10 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,wVar17);
    wVar18 = borg_slot(L'\x19',sv_scroll_protection_from_evil);
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
      bVar35 = L'\xffffffff' < wVar18 || _Var10;
    }
    else {
      bVar35 = false;
    }
    if (((pbVar36[lVar28].info & 2) == 0) && (borg.trait[0x1a] == 0)) {
      bVar35 = false;
    }
    _Var10 = borg_equips_item(act_protevil,true);
    if ((!_Var10) && (!bVar35)) {
      return L'\0';
    }
    wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    borg.temp.prot_from_evil = true;
    wVar16 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    borg.temp.prot_from_evil = false;
    wVar24 = wVar18 - wVar16;
    if (wVar24 != L'\0' && wVar16 <= wVar18) {
      if (borg_fighting_unique == L'\0') {
        wVar23 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar23 = (avoidance * 2) / 3;
      }
      if ((wVar16 <= wVar23) && ((int)avoidance / 7 < wVar18)) goto LAB_00215d5a;
    }
    if (borg_cfg[0x18] < 1) {
      borg.temp.prot_from_evil = false;
      return L'\0';
    }
    if (borg.trait[0x69] != 0) {
      borg.temp.prot_from_evil = false;
      return L'\0';
    }
LAB_00215d5a:
    if (borg_simulate == true) {
      borg.temp.prot_from_evil = false;
      return wVar24;
    }
    borg_note("# Attempting to cast PFE");
    _Var10 = borg_spell_fail(PROTECTION_FROM_EVIL,wVar17);
    if (((!_Var10) && (_Var10 = borg_activate_item(act_protevil), !_Var10)) &&
       (_Var10 = borg_read_scroll(sv_scroll_protection_from_evil), !_Var10)) {
      return wVar24;
    }
    borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
    return wVar24;
  case L'\n':
    if (((!borg.temp.shield) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if ((borg.has[kv_mush_stoneskin] < 1) &&
         (_Var10 = borg_equips_item(act_shroom_stone,true), !_Var10)) {
        return L'\0';
      }
      borg.temp.shield = true;
      wVar17 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      borg.temp.shield = false;
      if (borg_fighting_unique != L'\0') {
        wVar17 = (wVar17 * 7) / 10;
      }
      wVar18 = p1 - wVar17;
      if (wVar18 == L'\0' || p1 < wVar17) {
        borg.temp.shield = false;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar16 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar16 = (avoidance * 2) / 3;
      }
      if (wVar16 < wVar17) {
        borg.temp.shield = false;
        return L'\0';
      }
      if (p1 <= (int)avoidance / 7) {
        borg.temp.shield = false;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg.temp.shield = false;
        return wVar18;
      }
      borg_note("# Attempting to eat a stone skin");
      _Var10 = borg_eat(L'\x1d',sv_mush_stoneskin);
      if ((!_Var10) && (_Var10 = borg_activate_item(act_shroom_stone), !_Var10)) {
        return L'\0';
      }
      borg.no_rest_prep = 2000;
      return wVar18;
    }
    break;
  case L'\v':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (borg_fighting_unique == L'\0') {
        wVar17 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar17 = (avoidance * 7) / 10;
      }
      if ((((wVar17 <= p1) || (borg.trait[0x1e] < 0x1f)) || (!borg_simulate)) &&
         ((iVar30 = (int)avoidance, (iVar30 * 4) / 10 <= p1 || (!borg_simulate)))) {
        wVar17 = L'(';
        if ((p1 <= iVar30 * 3) && (wVar17 = L'-', p1 <= iVar30 * 2)) {
          wVar17 = (uint)((wchar_t)((ulong)((uint)(iVar30 * 5) >> 0x1f) + (long)(iVar30 * 5) >> 1) <
                         p1) * 5 + L'2';
        }
        _Var10 = borg_spell_okay_fail(TELEPORT_OTHER,wVar17);
        if ((((_Var10) || (_Var10 = borg_equips_item(act_tele_other,true), _Var10)) ||
            ((wVar17 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar7 = borg_items,
             wVar17 != L'\xffffffff' &&
             (wVar17 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar7[wVar17].pval != 0)))) &&
           (_Var10 = borg_surrounded(), !_Var10)) {
          if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
            return L'\0';
          }
          borg_temp_n = 0;
          borg_tp_other_n = 0;
          if (1 < borg_kills_nxt) {
            lVar32 = 1;
            lVar28 = 0x1d8;
            do {
              pbVar6 = borg_kills;
              if ((*(short *)(borg_kills->spell + lVar28 + -0x19) != 0) &&
                 (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar28))) {
                if (((~borg_grids[*(int *)(borg_kills->spell + lVar28 + -9)]
                       [*(int *)(borg_kills->spell + lVar28 + -0xd)].info & 0x28) == 0) &&
                   ((6 < (byte)(borg_grids[*(int *)(borg_kills->spell + lVar28 + -9)]
                                [*(int *)(borg_kills->spell + lVar28 + -0xd)].feat - 0x10) &&
                    (grid1_06.y = borg.c.y, grid1_06.x = borg.c.x,
                    wVar17 = distance(grid1_06,*(loc_conflict *)(borg_kills->spell + lVar28 + -0xd))
                    , wVar17 <= (int)(uint)z_info->max_range)))) {
                  borg_temp_x[borg_temp_n] = pbVar6->spell[lVar28 + -0xd];
                  borg_temp_y[borg_temp_n] = pbVar6->spell[lVar28 + -9];
                  borg_temp_n = borg_temp_n + 1;
                }
              }
              lVar32 = lVar32 + 1;
              lVar28 = lVar28 + 0x1d8;
            } while (lVar32 < borg_kills_nxt);
          }
          if ((borg_temp_n != 0) || (borg_simulate == false)) {
            _Var10 = false;
            wVar17 = borg_launch_bolt(L'\0',p1,L'-',(uint)z_info->max_range,L'\0');
            if (wVar17 < L'\x01') {
              return L'\0';
            }
            if (borg_simulate == true) {
              if (wVar17 <= (int)(short)(avoidance - (avoidance >> 0xf)) >> 1) {
                borg_tp_other_n = 0;
                borg_temp_n = 0;
                return L'\0';
              }
              borg_tp_other_n = 0;
              borg_temp_n = 0;
              return wVar17;
            }
            borg_log_spellpath(_Var10);
            uVar19 = (ulong)(ushort)borg_tp_other_n;
            if (0 < borg_tp_other_n) {
              lVar28 = 0;
              do {
                pcVar21 = format("# T.O. %d, index %d (%d,%d)",(ulong)(uint)(int)(short)uVar19,
                                 (ulong)(uint)borg_tp_other_index[lVar28],
                                 (ulong)borg_tp_other_y[lVar28],(ulong)borg_tp_other_x[lVar28]);
                borg_note(pcVar21);
                lVar28 = lVar28 + 1;
                uVar19 = (ulong)borg_tp_other_n;
              } while (lVar28 < (long)uVar19);
            }
            borg_temp_n = 0;
            borg_tp_other_n = 0;
            _Var10 = borg_spell(TELEPORT_OTHER);
            if (((_Var10) || (_Var10 = borg_activate_item(act_tele_other), _Var10)) ||
               (_Var10 = borg_aim_wand(sv_wand_teleport_away), _Var10)) {
              borg_keypress(0x35);
              successful_target = L'\xffffffff';
              return wVar17;
            }
          }
        }
      }
    }
    break;
  case L'\f':
    if (borg.temp.hero) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    _Var10 = borg_spell_okay_fail(HEROISM,L'\x0f');
    bVar35 = false;
    if (_Var10) {
      wVar17 = borg.trait[0x23];
      wVar18 = borg_heroism_level();
      bVar35 = wVar18 <= wVar17;
    }
    wVar17 = borg_slot(L'\x1a',sv_potion_heroism);
    if (wVar17 == L'\xffffffff' && !bVar35) {
      return L'\0';
    }
    if (p1 <= (int)avoidance / 10) {
      return L'\0';
    }
    if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
      return L'\0';
    }
    if (borg_simulate != false) {
      return L'\x01';
    }
    borg_note("# Attempting to cast Hero");
    if ((bVar35) && (_Var10 = borg_spell(HEROISM), _Var10)) {
      borg.no_rest_prep = 10000;
      return L'\x01';
    }
    _Var10 = borg_quaff_potion(sv_potion_heroism);
    goto LAB_00211ca4;
  case L'\r':
    if (borg.temp.berserk) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    _Var10 = borg_spell_okay_fail(BERSERK_STRENGTH,L'\x0f');
    if ((((!_Var10) && (wVar17 = borg_slot(L'\x1a',sv_potion_berserk), wVar17 == L'\xffffffff')) &&
        (_Var10 = borg_equips_item(act_berserker,true), !_Var10)) &&
       ((_Var10 = borg_equips_item(act_rage_bless_resist,true), !_Var10 &&
        (_Var10 = borg_equips_item(act_shero,true), !_Var10)))) {
      return L'\0';
    }
    if (p1 <= (int)avoidance / 10) {
      return L'\0';
    }
    if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
      return L'\0';
    }
    wVar17 = L'\x05';
    if (borg_simulate != false) {
      return L'\x05';
    }
    _Var10 = borg_spell(BERSERK_STRENGTH);
    if (_Var10) {
      return L'\x05';
    }
    _Var10 = borg_activate_item(act_berserker);
    if (_Var10) {
      return L'\x05';
    }
    _Var10 = borg_activate_item(act_rage_bless_resist);
    if (_Var10) {
      return L'\x05';
    }
    _Var10 = borg_activate_item(act_shero);
    if (_Var10) {
      return L'\x05';
    }
    _Var10 = borg_quaff_potion(sv_potion_berserk);
    goto LAB_00212ea2;
  case L'\x0e':
    if (borg.temp.smite_evil) {
      return L'\0';
    }
    if (borg.trait[0xc2] != 0) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    _Var10 = borg_spell_okay_fail(SMITE_EVIL,L'\x0f');
    if (!_Var10) {
      return L'\0';
    }
    _Var10 = near_evil();
    if (!_Var10) {
      return L'\0';
    }
    if (p1 <= (int)avoidance / 10) {
      return L'\0';
    }
    if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
      return L'\0';
    }
    wVar17 = L'\x05';
    if (borg_simulate != false) {
      return L'\x05';
    }
    _Var10 = borg_spell(SMITE_EVIL);
LAB_00212ea2:
    if (_Var10 != false) {
      return wVar17;
    }
    break;
  case L'\x0f':
    if (borg.temp.regen) {
      return L'\0';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    if (borg.trait[0x1c] < 100) {
      return L'\0';
    }
    _Var10 = borg_spell_okay_fail(RAPID_REGENERATION,L'\x0f');
    if (!_Var10) {
      return L'\0';
    }
    if (p1 <= (int)avoidance / 10) {
      return L'\0';
    }
    if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
      return L'\0';
    }
    if (borg_simulate != false) {
      return L'\x01';
    }
    _Var10 = borg_spell(RAPID_REGENERATION);
LAB_00211ca4:
    if (_Var10 != false) {
      borg.no_rest_prep = 10000;
      return L'\x01';
    }
    return L'\0';
  case L'\x10':
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
        ((borg.trait[0x79] == 0 &&
         ((pbVar36 = borg_grids[borg.c.y] + borg.c.x, pbVar36->take == '\0' &&
          (pbVar36->trap == false)))))) &&
       ((3 < (byte)(pbVar36->feat - 3) && (borg_fighting_unique < L'\n')))) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\x06';
      if ((p1 <= wVar18) && (wVar17 = L'\x14', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x19';
        if (p1 < wVar18 / 3) {
          wVar17 = L'-';
        }
      }
      _Var10 = borg_spell_okay_fail(GLYPH_OF_WARDING,wVar17);
      wVar18 = borg_slot(L'\x19',sv_scroll_rune_of_protection);
      _Var11 = borg_equips_item(act_glyph,true);
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
        bVar35 = (_Var11 || _Var10) || L'\xffffffff' < wVar18;
      }
      else {
        bVar35 = false;
      }
      if (((pbVar36->info & 2) == 0) && (borg.trait[0x1a] == 0)) {
        bVar35 = false;
      }
      if (!bVar35) {
        return L'\0';
      }
      borg_on_glyph = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      borg_on_glyph = false;
      wVar16 = p1 - wVar18;
      if (wVar16 == L'\0' || p1 < wVar18) {
        borg_on_glyph = false;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar24 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar24 = (avoidance * 2) / 3;
      }
      if (wVar24 < wVar18) {
        borg_on_glyph = false;
        return L'\0';
      }
      if (p1 <= (int)avoidance / 7) {
        borg_on_glyph = false;
        return L'\0';
      }
      if (borg_simulate == true) {
        borg_on_glyph = false;
        return wVar16;
      }
      _Var10 = borg_spell_fail(GLYPH_OF_WARDING,wVar17);
      if (((!_Var10) && (_Var10 = borg_read_scroll(sv_scroll_rune_of_protection), !_Var10)) &&
         (_Var10 = borg_activate_item(act_glyph), !_Var10)) {
        return L'\0';
      }
      if (0 < (long)track_glyph.num) {
        lVar28 = 0;
        do {
          if ((track_glyph.x[lVar28] == borg.c.x) && (track_glyph.y[lVar28] == borg.c.y)) {
            return wVar16;
          }
          lVar28 = lVar28 + 1;
        } while (track_glyph.num != lVar28);
      }
      if (track_glyph.size <= track_glyph.num) {
        return wVar16;
      }
      borg_note("# Noting the creation of a glyph.");
      track_glyph.x[track_glyph.num] = borg.c.x;
      track_glyph.y[track_glyph.num] = borg.c.y;
      track_glyph.num = track_glyph.num + 1;
      return wVar16;
    }
    break;
  case L'\x11':
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
       (borg_fighting_summoner)) {
      wVar18 = (wchar_t)avoidance;
      wVar17 = L'\v';
      if ((p1 <= wVar18) && (wVar17 = L'\x19', p1 <= (wVar18 * 2) / 3)) {
        wVar17 = L'\x1e';
        if (p1 < wVar18 / 3) {
          wVar17 = L'2';
        }
      }
      _Var10 = borg_spell_okay_fail(DOOR_CREATION,wVar17);
      if (!_Var10) {
        return L'\0';
      }
      iVar30 = 0;
      lVar28 = -1;
      do {
        lVar32 = -1;
        do {
          pbVar36 = borg_grids[borg.c.y + lVar32] + lVar28 + borg.c.x;
          if (((pbVar36->glyph != false) || (pbVar36->kill != '\0')) ||
             ((pbVar36->feat < 0x17 && ((0x600004U >> (pbVar36->feat & 0x1f) & 1) != 0)))) {
            iVar30 = iVar30 + 1;
          }
          if ((((pbVar36->take != '\0') || (pbVar36->trap != false)) ||
              ((byte)(pbVar36->feat - 3) < 4)) || (pbVar36->kill != '\0')) {
            iVar30 = iVar30 + 1;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != 2);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 2);
      if (iVar30 < 6) {
        borg_create_door = true;
        wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
        borg_create_door = false;
        wVar16 = p1 - wVar18;
        if (wVar16 == L'\0' || p1 < wVar18) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar24 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
        }
        else {
          wVar24 = (avoidance * 2) / 3;
        }
        if (wVar24 < wVar18) {
          borg_create_door = false;
          return L'\0';
        }
        if (p1 <= (int)avoidance / 7) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_simulate == true) {
          borg_create_door = false;
          return wVar16;
        }
        _Var10 = borg_spell_fail(DOOR_CREATION,wVar17);
        if (!_Var10) {
          return L'\0';
        }
        borg_needs_new_sea = true;
        breeder_level = true;
        return wVar16;
      }
    }
    break;
  case L'\x12':
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
       (((_Var10 = borg_spell_okay_fail(MASS_BANISHMENT,L'('), _Var10 ||
         (_Var10 = borg_equips_item(act_banishment,true), _Var10)) || (borg.trait[0xf9] != 0)))) {
      if ((p1 < (avoidance * 0xc) / 10) && (borg_simulate != false)) {
        return L'\0';
      }
      iVar30 = 0;
      iVar15 = 0;
      if (1 < borg_kills_nxt) {
        iVar15 = 0;
        lVar32 = 1;
        lVar28 = 0x1e4;
        iVar30 = 0;
        do {
          pmVar5 = r_info;
          uVar1 = *(ushort *)(borg_kills->spell + lVar28 + -0x25);
          if (((((ulong)uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
              (grid1_02.y = borg.c.y, grid1_02.x = borg.c.x,
              wVar17 = distance(grid1_02,*(loc_conflict *)(borg_kills->spell + lVar28 + -0x19)),
              wVar17 < L'\x15')) &&
             (_Var10 = flag_has_dbg(pmVar5[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var10))
          {
            wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar32,true,true);
            iVar30 = iVar30 + wVar17;
            iVar15 = iVar15 + 3;
          }
          lVar32 = lVar32 + 1;
          lVar28 = lVar28 + 0x1d8;
        } while (lVar32 < borg_kills_nxt);
      }
      if (borg.trait[0x1b] <= (iVar15 * 0xc) / 10) {
        return L'\0';
      }
      iVar27 = p1 - iVar30;
      if (p1 - iVar30 < 1) {
        iVar27 = 0;
      }
      wVar17 = iVar27 + iVar15;
      if (0x1a < iVar15 && L'\t' < borg_fighting_unique) {
        wVar17 = (uint)(wVar17 * 6) / 10;
      }
      wVar18 = p1 - wVar17;
      if (wVar18 == L'\0' || p1 < wVar17) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar16 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar16 = (avoidance * 2) / 3;
      }
      if (wVar16 < wVar17) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar18;
      }
      _Var10 = borg_read_scroll(sv_scroll_mass_banishment);
      if (((!_Var10) && (_Var10 = borg_activate_item(act_banishment), !_Var10)) &&
         (_Var10 = borg_spell(MASS_BANISHMENT), !_Var10)) {
        return L'\0';
      }
      if (borg_kills_nxt < 2) {
        return wVar18;
      }
      lVar32 = 1;
      lVar28 = 0x1d8;
      do {
        uVar1 = *(ushort *)(borg_kills->spell + lVar28 + -0x19);
        if (((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
           (_Var10 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"),
           !_Var10)) {
          borg_delete_kill((wchar_t)lVar32);
        }
        lVar32 = lVar32 + 1;
        lVar28 = lVar28 + 0x1d8;
      } while (lVar32 < borg_kills_nxt);
      return wVar18;
    }
    break;
  case L'\x13':
    wVar17 = (wchar_t)avoidance;
    wVar18 = L'\x06';
    if (((p1 <= wVar17) && (wVar18 = L'\x0f', p1 <= (wVar17 * 2) / 3)) &&
       (wVar18 = L'\x19', p1 < wVar17 / 3)) {
      wVar18 = L'#';
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    uVar1 = borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb];
    uVar2 = borg_fear_monsters[borg.c.y][borg.c.x];
    _Var10 = borg_spell_okay_fail(BANISHMENT,wVar18);
    if (((!_Var10) && (_Var10 = borg_equips_item(act_banishment,true), !_Var10)) &&
       ((_Var10 = borg_equips_staff_fail(sv_staff_banishment), !_Var10 &&
        (wVar17 = borg_slot(L'\x19',sv_scroll_banishment), wVar17 == L'\xffffffff')))) {
      return L'\0';
    }
    if (borg.trait[0x1b] < 0x4c) {
      return L'\0';
    }
    memset(local_438,0,0x3fc);
    memset(local_c38,0,0x3fc);
    memset(local_838,0,0x3fc);
    iVar30 = 0;
    if (1 < borg_kills_nxt) {
      iVar30 = 0;
      lVar28 = 1;
      lVar32 = 0x1e8;
      do {
        pbVar6 = borg_kills;
        pmVar5 = r_info;
        uVar19 = (ulong)*(ushort *)(borg_kills->spell + lVar32 + -0x29);
        if (((uVar19 != 0) &&
            ((int)(uint)*(ushort *)(borg_kills->spell + lVar32 + -0x29) < (int)(z_info->r_max - 1)))
           && (_Var10 = flag_has_dbg(r_info[uVar19].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var10
              )) {
          wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar28,true,true);
          wVar18 = borg_danger_one_kill
                             (*(wchar_t *)(pbVar6->spell + lVar32 + -0x19),
                              *(wchar_t *)(pbVar6->spell + lVar32 + -0x1d),L'\x01',(wchar_t)lVar28,
                              true,true);
          bVar13 = (byte)pmVar5[uVar19].d_char;
          local_438[bVar13] = local_438[bVar13] + wVar17;
          local_838[bVar13] = local_838[bVar13] + wVar18;
          iVar30 = iVar30 + wVar17;
          local_c38[bVar13] = local_c38[bVar13] + 1;
        }
        lVar28 = lVar28 + 1;
        lVar32 = lVar32 + 0x1d8;
      } while (lVar28 < borg_kills_nxt);
    }
    iVar27 = p1 - ((uint)uVar1 + (uint)uVar2);
    wVar17 = L'\x01';
    uVar38 = 0;
    uVar26 = 0;
    uVar19 = 0;
    iVar15 = 0;
    do {
      if (local_c38[uVar38] != 0) {
        wVar18 = local_438[uVar38];
        wVar16 = wVar17;
        if (wVar17 < wVar18) {
          wVar16 = wVar18;
          iVar15 = iVar30 - wVar18;
        }
        uVar26 = uVar26 & 0xff;
        if (wVar17 < wVar18) {
          uVar26 = uVar38 & 0xffffffff;
        }
        wVar18 = local_838[uVar38];
        wVar17 = wVar16;
        if (wVar16 < wVar18) {
          wVar17 = wVar18;
        }
        uVar19 = uVar19 & 0xff;
        if (wVar16 < wVar18) {
          uVar19 = uVar38 & 0xffffffff;
        }
        if (borg_simulate == false) {
          pcVar21 = format("# Race \'%c\' is a threat with total danger %d from %d individuals.",
                           uVar38 & 0xffffffff);
          borg_note(pcVar21);
        }
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != 0xff);
    if ((char)uVar19 == '\0') {
      uVar19 = 0;
    }
    else {
      uVar31 = (uint)uVar19 & 0xff;
      if (borg.trait[0x1b] < 0x177) {
        uVar31 = 0;
      }
      if (SBORROW4(local_838[uVar31],borg.trait[0x1c] * 3) !=
          local_838[uVar31] + borg.trait[0x1c] * -3 < 0) {
        uVar31 = 0;
      }
      if (borg.trait[0x1b] <= (int)(local_c38[uVar31] * 0x30) / 10) {
        uVar31 = 0;
      }
      uVar19 = (ulong)uVar31;
      if (0x4a < (int)local_c38[uVar31]) {
        uVar19 = 0;
      }
      if ((int)avoidance / 5 < iVar27) {
        uVar19 = 0;
      }
      if ((char)uVar19 != '\0') {
        uVar38 = (ulong)(uint)((int)uVar19 * 4);
        pcVar21 = format("# Race \'%c\' is a real threat with total danger %d from %d individuals.",
                         uVar19,(ulong)*(uint *)((long)local_838 + uVar38),
                         (ulong)*(uint *)((long)local_c38 + uVar38));
        borg_note(pcVar21);
      }
    }
    cVar29 = (char)uVar19;
    cVar14 = cVar29;
    if ((char)uVar26 == '\0') {
      uVar31 = 0;
    }
    else {
      uVar38 = uVar26 & 0xff;
      if (borg.trait[0x1b] <= (int)(local_c38[uVar26 & 0xff] * 0x30) / 10) {
        uVar38 = 0;
      }
      bVar13 = (byte)uVar38;
      if ((iVar27 < (avoidance * 7) / 10) ||
         ((0x4b < borg.trait[0x69] && (iVar27 < (avoidance * 6) / 10)))) {
        bVar13 = 0;
      }
      uVar31 = (uint)bVar13;
      if (iVar15 <= (int)(short)(avoidance - (avoidance >> 0xf)) >> 1) {
        uVar31 = 0;
      }
      if ((char)uVar31 != '\0') {
        cVar14 = (char)uVar31;
      }
    }
    if (cVar14 == '\0') {
      return L'\0';
    }
    cVar37 = (char)uVar31;
    if (borg_simulate == true) {
      if (cVar37 != '\0') goto LAB_0021542b;
      if (cVar29 != '\0') goto LAB_00215c08;
    }
    wVar17 = (wchar_t)cVar14;
    if (cVar37 != '\0') {
      pcVar21 = format("# Banishing race \'%c\' (qty:%d).  Danger after spell:%d",
                       (ulong)(uint)wVar17,(ulong)local_c38[uVar31],iVar15);
      borg_note(pcVar21);
    }
    if (cVar29 != '\0') {
      uVar26 = (ulong)(uint)((int)uVar19 << 2);
      pcVar21 = format("# Banishing race \'%c\' (qty:%d).  Danger from them:%d",(ulong)(uint)wVar17,
                       (ulong)*(uint *)((long)local_c38 + uVar26),
                       (ulong)*(uint *)((long)local_838 + uVar26));
      borg_note(pcVar21);
    }
    _Var10 = borg_read_scroll(sv_scroll_banishment);
    if ((((_Var10) || (_Var10 = borg_spell(BANISHMENT), _Var10)) ||
        ((_Var10 = borg_activate_item(act_banishment), _Var10 ||
         (_Var10 = borg_use_staff(sv_staff_banishment), _Var10)))) &&
       (borg_keypress(wVar17), 1 < borg_kills_nxt)) {
      lVar32 = 1;
      lVar28 = 0x1d8;
      do {
        if ((r_info[*(ushort *)(borg_kills->spell + lVar28 + -0x19)].d_char == wVar17) &&
           (_Var10 = flag_has_dbg(r_info[*(ushort *)(borg_kills->spell + lVar28 + -0x19)].flags,0xb,
                                  1,"r_ptr->flags","RF_UNIQUE"), !_Var10)) {
          borg_delete_kill((wchar_t)lVar32);
        }
        lVar32 = lVar32 + 1;
        lVar28 = lVar28 + 0x1d8;
      } while (lVar32 < borg_kills_nxt);
    }
    if (cVar37 == '\0') {
      if (cVar29 == '\0') {
        return L'\0';
      }
LAB_00215c08:
      return local_838[uVar19];
    }
LAB_0021542b:
    return iVar27 - iVar15;
  case L'\x14':
    if (((((0xf9 < borg.trait[0x1b]) && ((borg.trait[0x1c] * 7) / 10 <= borg.trait[0x1b])) &&
         (0x18 < borg.trait[0x69])) && ((borg.trait[0x70] == 0 && (borg.trait[0x72] == 0)))) &&
       (borg.trait[0x79] == 0)) {
      sVar22 = avoidance + 3;
      if (-1 < avoidance) {
        sVar22 = avoidance;
      }
      if ((p1 <= (int)sVar22 >> 2) &&
         (((_Var10 = borg_spell_okay_fail(BANISHMENT,L'#'), _Var10 ||
           (_Var10 = borg_equips_item(act_banishment,true), _Var10)) ||
          (_Var10 = borg_equips_staff_fail(sv_staff_banishment), _Var10)))) {
        uVar19 = 0xffffffff;
        iVar30 = -1;
        if ((ulong)borg_nasties_num != 0) {
          uVar26 = 0;
          do {
            if (borg_nasties_limit[uVar26] <= borg_nasties_count[uVar26]) {
              uVar19 = uVar26 & 0xffffffff;
            }
            iVar30 = (int)uVar19;
            uVar26 = uVar26 + 1;
          } while (borg_nasties_num != uVar26);
        }
        if (iVar30 == -1) {
          return L'\0';
        }
        if (borg_simulate != false) {
          return L'\n';
        }
        pcVar21 = format("# Banishing nasties \'%c\' (qty:%d).",
                         (ulong)(uint)(int)borg_nasties[iVar30],(ulong)borg_nasties_count[iVar30]);
        borg_note(pcVar21);
        _Var10 = borg_activate_item(act_banishment);
        if (((_Var10) || (_Var10 = borg_use_staff(sv_staff_banishment), _Var10)) ||
           (_Var10 = borg_spell(BANISHMENT), _Var10)) {
          borg_keypress((int)borg_nasties[iVar30]);
          borg_nasties_count[iVar30] = '\0';
          if (borg_kills_nxt < 2) {
            return L'\n';
          }
          lVar28 = 1;
          lVar32 = 0x1d8;
          do {
            if (r_info[*(ushort *)(borg_kills->spell + lVar32 + -0x19)].d_char ==
                (int)borg_nasties[iVar30]) {
              borg_delete_kill((wchar_t)lVar28);
            }
            lVar28 = lVar28 + 1;
            lVar32 = lVar32 + 0x1d8;
          } while (lVar28 < borg_kills_nxt);
          return L'\n';
        }
      }
    }
    break;
  case L'\x15':
    if (!borg_simulate) {
      borg_needs_new_sea = true;
      _Var10 = borg_spell(TREMOR);
      if (_Var10) {
        borg_keypress(0x2a);
        borg_keypress(0x35);
      }
      else {
        _Var10 = borg_spell(QUAKE);
        if (_Var10) {
          return L'✏';
        }
        _Var10 = borg_spell(GRONDS_BLOW);
        if (_Var10) {
          return L'✏';
        }
        _Var10 = borg_activate_item(act_earthquakes);
        if (_Var10) {
          return L'✏';
        }
      }
    }
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
       (((_Var10 = borg_spell_okay_fail(TREMOR,L'#'), _Var10 ||
         (_Var10 = borg_spell_okay_fail(QUAKE,L'#'), _Var10)) ||
        ((_Var10 = borg_spell_okay_fail(GRONDS_BLOW,L'#'), _Var10 ||
         (_Var10 = borg_equips_item(act_earthquakes,true), _Var10)))))) {
      if ((p1 < (avoidance * 6) / 10) && (borg_fighting_summoner != true)) {
        return L'\0';
      }
      if (borg_kills_nxt < 1) {
        iVar30 = 0;
      }
      else {
        lVar32 = 0;
        lVar28 = 0xc;
        iVar30 = 0;
        do {
          pbVar6 = borg_kills;
          _Var10 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar28 + -0x15),
                            *(wchar_t *)(borg_kills->spell + lVar28 + -0x19));
          if ((_Var10) && (pbVar6->spell[lVar28 + -0xd] != '\0')) {
            grid2.y = borg.c.y;
            grid2.x = borg.c.x;
            wVar17 = distance(*(loc_conflict *)(pbVar6->spell + lVar28 + -0x19),grid2);
            iVar30 = iVar30 + (uint)(L'\x01' < wVar17);
          }
          lVar32 = lVar32 + 1;
          lVar28 = lVar28 + 0x1d8;
        } while (lVar32 < borg_kills_nxt);
      }
      wVar17 = L'✏';
      if ((3 < iVar30) && ((avoidance * 7) / 10 < p1)) {
        wVar17 = p1 / 3;
      }
      if ((iVar30 == 3) && ((avoidance * 7) / 10 < p1)) {
        wVar17 = (p1 * 6) / 10;
      }
      if (p1 - wVar17 == L'\0' || p1 < wVar17) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar18 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar18 = (avoidance * 2) / 3;
      }
      if (wVar18 < wVar17) {
        return L'\0';
      }
      if (p1 <= (int)avoidance / 5) {
        return L'\0';
      }
      if (borg_simulate == false) {
        return L'\0';
      }
      return p1 - wVar17;
    }
    break;
  case L'\x16':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (!borg_simulate) {
        _Var10 = borg_spell(WORD_OF_DESTRUCTION);
        if (_Var10) {
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        _Var10 = borg_use_staff(sv_staff_destruction);
        if (!_Var10) {
          _Var10 = borg_activate_item(act_destruction2);
          if (!_Var10) {
            return L'Ǵ';
          }
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        borg_needs_new_sea = true;
        return L'Ǵ';
      }
      if (!borg_morgoth_position) {
        bVar35 = avoidance < p1;
        bVar39 = bVar35;
        if (((((int)avoidance << 3) / 10 < p1) && (0x59 < borg.trait[0x69])) &&
           (bVar39 = true, 300 < borg.trait[0x1b])) {
          bVar39 = bVar35;
        }
        if (((bVar39) &&
            (((borg.trait[0xd3] == 0 && (borg.trait[0xf7] == 0)) ||
             ((L'\x04' < borg_fighting_unique ||
              ((borg.trait[0x1b] < 0x113 || (_Var10 = borg_caution_teleport(L'K',L'\x02'), !_Var10))
              )))))) &&
           ((borg.trait[0xd4] < 2 ||
            ((borg.trait[0x1b] < 0x113 || (_Var10 = borg_caution_teleport(L'K',L'\x02'), !_Var10))))
           )) {
          _Var10 = borg_spell_okay_fail(WORD_OF_DESTRUCTION,L'7');
          if ((_Var10) ||
             ((_Var10 = borg_equips_staff_fail(sv_staff_destruction), _Var10 ||
              (_Var10 = borg_equips_item(act_destruction2,true), _Var10)))) {
            bVar35 = true;
          }
          else {
            bVar35 = false;
          }
          bVar39 = bVar35;
          if ((avoidance * 4 < p1) || ((avoidance < p1 && (borg.trait[0x1b] < 0x97)))) {
            _Var10 = borg_equips_staff_fail(sv_staff_destruction);
            bVar39 = true;
            if (!_Var10) {
              bVar39 = bVar35;
            }
          }
          if (!bVar39) {
            return L'\0';
          }
          wVar17 = p1;
          if (p1 < avoidance * 2) {
            wVar17 = L'\0';
          }
          if (L'\x02' < borg_fighting_unique) {
            wVar17 = p1;
          }
          if (L'\t' < borg_fighting_unique) {
            wVar17 = L'\0';
          }
          if (borg_simulate != false) {
            return wVar17;
          }
          return L'\0';
        }
      }
    }
    break;
  case L'\x17':
    if ((!borg_simulate) && (_Var10 = borg_spell(TELEPORT_LEVEL), _Var10)) {
      borg_needs_new_sea = true;
      return L'Ǵ';
    }
    if ((((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
         (avoidance * 2 <= p1)) &&
        (((borg.trait[0xd3] == 0 && (borg.trait[0xf7] == 0)) ||
         (_Var10 = borg_caution_teleport(L'A',L'\x02'), !_Var10)))) &&
       (((borg.trait[0xd4] < 2 || (_Var10 = borg_caution_teleport(L'A',L'\x02'), !_Var10)) &&
        ((_Var10 = borg_spell_okay_fail(TELEPORT_LEVEL,L'7'), _Var10 && (morgoth_on_level == false))
        )))) {
      if ((L'\0' < borg_fighting_unique) && (borg_as_position != false)) {
        return L'\0';
      }
      if (borg_simulate == false) {
        return L'\0';
      }
      return p1;
    }
    break;
  case L'\x18':
    if ((int)avoidance / 10 <= p1) {
      wVar17 = L'\x0f';
      if (avoidance * 4 < p1) {
        wVar17 = L'\x05';
      }
      if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
        if (borg.trait[0x79] != 0) {
          return L'\0';
        }
        _Var10 = borg_equips_item(act_loskill,true);
        if (_Var10) {
          bVar35 = 100 < borg.has[0x1b];
        }
        else {
          bVar35 = false;
        }
        if ((bVar35) || (_Var10 = borg_spell_okay_fail(BANISH_EVIL,wVar17), _Var10)) {
          iVar30 = 1;
          if (1 < borg_kills_nxt) {
            lVar28 = 1;
            lVar32 = 0x1e8;
            do {
              if ((*(short *)(borg_kills->spell + lVar32 + -0x29) != 0) &&
                 (_Var10 = borg_projectable(borg.c.y,borg.c.x,
                                            *(wchar_t *)(borg_kills->spell + lVar32 + -0x19),
                                            *(wchar_t *)(borg_kills->spell + lVar32 + -0x1d)),
                 _Var10)) {
                wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar28,true,true);
                iVar30 = iVar30 + wVar17;
              }
              lVar28 = lVar28 + 1;
              lVar32 = lVar32 + 0x1d8;
            } while (lVar28 < borg_kills_nxt);
          }
          bVar39 = true;
          local_c4c = iVar30;
          if (1 < borg_kills_nxt) {
            lVar28 = 1;
            lVar32 = 0x1d8;
            local_c50 = 0;
            do {
              pbVar6 = borg_kills;
              pmVar5 = r_info;
              uVar1 = *(ushort *)(borg_kills->spell + lVar32 + -0x19);
              if (((ulong)uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) {
                wVar17 = *(wchar_t *)(borg_kills->spell + lVar32 + -0xd);
                pbVar36 = borg_grids[*(wchar_t *)(borg_kills->spell + lVar32 + -9)];
                _Var10 = borg_projectable(borg.c.y,borg.c.x,
                                          *(wchar_t *)(borg_kills->spell + lVar32 + -9),wVar17);
                if (_Var10) {
                  if (borg_simulate == false) {
                    uVar3 = *(undefined4 *)(pbVar6->spell + lVar32 + -0xd);
                    uVar4 = *(undefined4 *)(pbVar6->spell + lVar32 + -9);
                    pcVar21 = borg_race_name((uint)*(ushort *)(pbVar6->spell + lVar32 + -0x19));
                    wVar18 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar36[wVar17].kill,true,
                                        false);
                    pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. is considered.",
                                     uVar4,uVar3,pcVar21,(ulong)(uint)wVar18);
                    borg_note(pcVar21);
                  }
                  _Var10 = flag_has_dbg(pmVar5[uVar1].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
                  if (_Var10) {
                    _Var10 = flag_has_dbg(pmVar5[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
                    if ((_Var10) && (0x3c < *(short *)((long)pbVar6->spell_flags + lVar32 + -8))) {
                      if (borg_simulate == false) {
                        uVar3 = *(undefined4 *)(pbVar6->spell + lVar32 + -0xd);
                        uVar4 = *(undefined4 *)(pbVar6->spell + lVar32 + -9);
                        pcVar21 = borg_race_name((uint)*(ushort *)(pbVar6->spell + lVar32 + -0x19));
                        wVar17 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(uint)pbVar36[wVar17].kill,
                                            true,false);
                        pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. Unique not considered: Injury %d."
                                         ,uVar4,uVar3,pcVar21,(ulong)(uint)wVar17);
                        goto LAB_00214f87;
                      }
                    }
                    else {
                      _Var10 = borg_cave_floor_bold
                                         (*(wchar_t *)(pbVar6->spell + lVar32 + -9),
                                          *(wchar_t *)(pbVar6->spell + lVar32 + -0xd));
                      if (_Var10) {
                        if (borg_simulate == false) {
                          uVar3 = *(undefined4 *)(pbVar6->spell + lVar32 + -0xd);
                          uVar31 = *(uint *)(pbVar6->spell + lVar32 + -9);
                          pcVar21 = borg_race_name((uint)*(ushort *)(pbVar6->spell + lVar32 + -0x19)
                                                  );
                          wVar17 = borg_danger_one_kill
                                             (borg.c.y,borg.c.x,L'\x01',(uint)pbVar36[wVar17].kill,
                                              true,true);
                          pcVar21 = format("# Banishing Evil: (%d,%d): %s, danger %d. Booted.",
                                           (ulong)uVar31,uVar3,pcVar21,(ulong)(uint)wVar17);
                          borg_note(pcVar21);
                          borg_delete_kill((wchar_t)lVar28);
                        }
                        local_c50 = local_c50 + 1;
                        wVar17 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar28,true,true);
                        local_c4c = local_c4c - wVar17;
                      }
                      else if (borg_simulate == false) {
                        uVar3 = *(undefined4 *)(pbVar6->spell + lVar32 + -0xd);
                        uVar31 = *(uint *)(pbVar6->spell + lVar32 + -9);
                        pcVar21 = borg_race_name((uint)*(ushort *)(pbVar6->spell + lVar32 + -0x19));
                        wVar17 = borg_danger_one_kill
                                           (borg.c.y,borg.c.x,L'\x01',(uint)pbVar36[wVar17].kill,
                                            true,true);
                        fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (in wall).";
                        goto LAB_00214f74;
                      }
                    }
                  }
                  else if (borg_simulate == false) {
                    uVar3 = *(undefined4 *)(pbVar6->spell + lVar32 + -0xd);
                    uVar31 = *(uint *)(pbVar6->spell + lVar32 + -9);
                    pcVar21 = borg_race_name((uint)*(ushort *)(pbVar6->spell + lVar32 + -0x19));
                    wVar17 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar36[wVar17].kill,true,
                                        false);
                    fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (not evil).";
LAB_00214f74:
                    pcVar21 = format(fmt,(ulong)uVar31,uVar3,pcVar21,(ulong)(uint)wVar17);
LAB_00214f87:
                    borg_note(pcVar21);
                  }
                }
              }
              lVar28 = lVar28 + 1;
              lVar32 = lVar32 + 0x1d8;
            } while (lVar28 < borg_kills_nxt);
            bVar39 = local_c50 == 0;
          }
          if (borg_simulate == false) {
            if ((bVar35) && (_Var10 = borg_activate_item(act_loskill), _Var10)) {
              return iVar30 - local_c4c;
            }
            _Var10 = borg_spell(BANISH_EVIL);
            if (_Var10) {
              return iVar30 - local_c4c;
            }
          }
          iVar15 = 0;
          if (0 < local_c4c) {
            iVar15 = local_c4c;
          }
          iVar27 = 9999;
          if (!bVar39) {
            iVar27 = iVar15;
          }
          if (((L'\t' < borg_fighting_unique) && (0xfa < borg.trait[0x1b])) &&
             (borg.trait[0x69] == 99)) {
            iVar27 = 9999;
          }
          if (((L'\t' < borg_fighting_unique) && (0x15e < borg.trait[0x1b])) &&
             (borg.trait[0x69] == 100)) {
            iVar27 = 9999;
          }
          if (iVar30 - iVar27 == L'\0' || iVar30 < iVar27) {
            return L'\0';
          }
          if (borg_fighting_unique == L'\0') {
            iVar15 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
          }
          else {
            iVar15 = (avoidance * 2) / 3;
          }
          if (iVar15 < iVar27) {
            return L'\0';
          }
          if (borg_simulate == false) {
            return L'\0';
          }
          return iVar30 - iVar27;
        }
      }
    }
    break;
  case L'\x19':
    if (((borg.trait[0x79] == 0) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 &&
        (((borg.see_inv == 0 && ((int)borg_t <= borg.need_see_invis + 5)) && (p1 <= avoidance * 2)))
        ))) {
      pbVar36 = borg_grids[borg.c.y];
      lVar28 = (long)borg.c.x;
      wVar17 = borg_slot(L'\x1a',sv_potion_detect_invis);
      if ((((wVar17 != L'\xffffffff') ||
           (wVar17 = borg_slot(L'\x19',sv_scroll_detect_invis), wVar17 != L'\xffffffff')) ||
          ((_Var10 = borg_equips_staff_fail(sv_staff_detect_invis), _Var10 ||
           (((_Var10 = borg_equips_staff_fail(sv_staff_detect_evil), _Var10 ||
             (_Var10 = borg_spell_okay_fail(SENSE_INVISIBLE,L'\x19'), _Var10)) ||
            ((_Var10 = borg_spell_okay_fail(DETECTION,L'\x19'), _Var10 ||
             ((((_Var10 = borg_equips_item(act_detect_invis,true), _Var10 ||
                (_Var10 = borg_equips_item(act_tmd_sinvis,true), _Var10)) ||
               (_Var10 = borg_equips_item(act_tmd_esp,true), _Var10)) ||
              (_Var10 = borg_equips_item(act_detect_evil,true), _Var10)))))))))) &&
         (((pbVar36[lVar28].info & 2) != 0 || (borg.trait[0x1a] != 0)))) {
        if (borg_simulate != false) {
          return L'\n';
        }
        _Var10 = borg_spell_fail(REVEAL_MONSTERS,L'\x19');
        if ((((_Var10) || (_Var10 = borg_read_scroll(sv_scroll_detect_invis), _Var10)) ||
            ((_Var10 = borg_use_staff(sv_staff_detect_invis), _Var10 ||
             (((_Var10 = borg_use_staff(sv_staff_detect_evil), _Var10 ||
               (_Var10 = borg_activate_item(act_detect_invis), _Var10)) ||
              (_Var10 = borg_activate_item(act_tmd_sinvis), _Var10)))))) ||
           ((_Var10 = borg_activate_item(act_tmd_esp), _Var10 ||
            (_Var10 = borg_activate_item(act_detect_evil), _Var10)))) {
          borg.see_inv = 3000;
        }
        else {
          _Var10 = borg_quaff_potion(sv_potion_detect_invis);
          if (_Var10) {
            borg.see_inv = 18000;
            borg.no_rest_prep = 18000;
          }
          else {
            _Var10 = borg_spell_fail(SENSE_INVISIBLE,L'\x19');
            if (!_Var10) {
              return L'\0';
            }
            borg.see_inv = 30000;
            borg.no_rest_prep = 16000;
          }
        }
        return L'\n';
      }
    }
    break;
  case L'\x1a':
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] != 0) {
      return L'\0';
    }
    if (borg.need_see_invis + 2 < (int)borg_t) {
      return L'\0';
    }
    wVar17 = borg.c.y + L'\xffffffff';
    _Var10 = borg_cave_floor_bold(wVar17,borg.c.x);
    if (_Var10) {
      wVar18 = iVar15 + L'\x01';
      _Var10 = borg_cave_floor_bold(wVar18,iVar30);
      if (_Var10) {
        wVar16 = iVar30 + L'\xffffffff';
        _Var10 = borg_cave_floor_bold(iVar15,wVar16);
        if (!_Var10) {
          wVar24 = iVar30 + L'\x01';
          _Var10 = borg_cave_floor_bold(iVar15,wVar24);
          if ((((!_Var10) && (_Var10 = borg_cave_floor_bold(wVar18,wVar16), !_Var10)) &&
              (_Var10 = borg_cave_floor_bold(wVar18,wVar24), !_Var10)) &&
             (_Var10 = borg_cave_floor_bold(wVar17,wVar16), !_Var10)) {
            _Var10 = borg_cave_floor_bold(wVar17,wVar24);
            bVar35 = !_Var10;
            goto LAB_00214342;
          }
        }
      }
    }
    bVar35 = false;
LAB_00214342:
    wVar18 = iVar30 + L'\xffffffff';
    _Var10 = borg_cave_floor_bold(iVar15,wVar18);
    bVar39 = bVar35;
    if (_Var10) {
      wVar16 = iVar30 + L'\x01';
      _Var10 = borg_cave_floor_bold(iVar15,wVar16);
      if ((_Var10) && (_Var10 = borg_cave_floor_bold(wVar17,iVar30), !_Var10)) {
        wVar24 = iVar15 + L'\x01';
        _Var10 = borg_cave_floor_bold(wVar24,iVar30);
        if (((!_Var10) &&
            ((_Var10 = borg_cave_floor_bold(wVar24,wVar18), !_Var10 &&
             (_Var10 = borg_cave_floor_bold(wVar24,wVar16), !_Var10)))) &&
           (_Var10 = borg_cave_floor_bold(wVar17,wVar18), !_Var10)) {
          _Var10 = borg_cave_floor_bold(wVar17,wVar16);
          bVar39 = true;
          if (_Var10) {
            bVar39 = bVar35;
          }
        }
      }
    }
    _Var10 = borg_cave_floor_bold(wVar17,iVar30);
    bVar35 = bVar39;
    if (((_Var10) && (_Var10 = borg_cave_floor_bold(iVar15 + L'\x01',iVar30), _Var10)) &&
       (_Var10 = borg_cave_floor_bold(iVar15,wVar18), !_Var10)) {
      _Var10 = borg_cave_floor_bold(iVar15,iVar30 + L'\x01');
      bVar35 = true;
      if (_Var10) {
        bVar35 = bVar39;
      }
    }
    _Var10 = borg_cave_floor_bold(iVar15,wVar18);
    bVar39 = bVar35;
    if (((_Var10) && (_Var10 = borg_cave_floor_bold(iVar15,iVar30 + L'\x01'), _Var10)) &&
       (_Var10 = borg_cave_floor_bold(wVar17,iVar30), !_Var10)) {
      _Var10 = borg_cave_floor_bold(iVar15 + L'\x01',iVar30);
      bVar39 = true;
      if (_Var10) {
        bVar39 = bVar35;
      }
    }
    if (!bVar39) {
      return L'\0';
    }
    if (borg_simulate == true) {
      iVar30 = avoidance * 3;
      iVar15 = avoidance * 3 + 3;
      if (-1 < iVar30) {
        iVar15 = iVar30;
      }
      if (iVar15 >> 2 < p1) {
        return L'\0';
      }
    }
    _Var10 = borg_light_beam(true);
    if (!_Var10) {
      return L'\0';
    }
    if (borg_simulate != false) {
      return L'\n';
    }
    _Var10 = borg_light_beam(false);
    if (_Var10) {
      return L'\n';
    }
    return L'\0';
  case L'\x1b':
    iVar30 = Term->offset_x;
    wVar17 = borg_panel_wid();
    iVar30 = iVar30 / wVar17;
    iVar15 = Term->offset_y;
    wVar17 = borg_panel_hgt();
    iVar15 = iVar15 / wVar17;
    if ((borg.need_shift_panel == false) && (borg.trait[0x69] < 0x46)) {
      return L'\0';
    }
    if (((borg.trait[0x69] == 100) && (w_y == morgy_panel_y)) && (w_x == morgy_panel_x)) {
      return L'\0';
    }
    uVar31 = 0;
    if (iVar30 == 0) {
      uVar31 = 6;
    }
    if (8 < borg.c.x - 0x34U) {
      uVar31 = 0;
    }
    uVar33 = uVar31;
    if (iVar30 == 1) {
      uVar33 = 6;
    }
    if (10 < borg.c.x - 0x54U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar30 == 2) {
      uVar31 = 6;
    }
    if (7 < borg.c.x - 0x74U) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar30 == 3) {
      uVar33 = 6;
    }
    if (0xb < borg.c.x - 0x94U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar30 == 4) {
      uVar31 = 4;
    }
    if (6 < borg.c.x - 0x88U) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar30 == 3) {
      uVar33 = 4;
    }
    if (7 < borg.c.x - 0x67U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar30 == 2) {
      uVar31 = 4;
    }
    if (8 < borg.c.x - 0x46U) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar30 == 1) {
      uVar33 = 4;
    }
    if (9 < borg.c.x - 0x25U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar15 == 0) {
      uVar31 = 2;
    }
    if (4 < borg.c.y - 0xfU) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar15 == 1) {
      uVar33 = 2;
    }
    if (5 < borg.c.y - 0x19U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar15 == 2) {
      uVar31 = 2;
    }
    if (5 < borg.c.y - 0x24U) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar15 == 3) {
      uVar33 = 2;
    }
    if (4 < borg.c.y - 0x30U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar15 == 4) {
      uVar31 = 8;
    }
    if (4 < borg.c.y - 0x2fU) {
      uVar31 = uVar33;
    }
    uVar33 = uVar31;
    if (iVar15 == 3) {
      uVar33 = 8;
    }
    if (4 < borg.c.y - 0x23U) {
      uVar33 = uVar31;
    }
    uVar31 = uVar33;
    if (iVar15 == 2) {
      uVar31 = 8;
    }
    if (4 < borg.c.y - 0x18U) {
      uVar31 = uVar33;
    }
    uVar33 = 8;
    if (iVar15 != 1) {
      uVar33 = uVar31;
    }
    if (4 < borg.c.y - 0xdU) {
      uVar33 = uVar31;
    }
    if (borg.need_shift_panel != false) {
      borg_keypress(0x4c);
      if (uVar33 != 0) {
        borg_keypress(uVar33 | 0x30);
      }
      borg_keypress(0xe000);
      borg_note("# Shifted panel to locate offscreen monster.");
      borg.need_shift_panel = false;
      borg_keypress(0xe000);
      return L'\0';
    }
    if (borg.when_shift_panel == 0) {
      if (track_step.num == 0) {
        return L'\0';
      }
    }
    else {
      if ((int)borg_t - (int)borg.when_shift_panel < 0xb) {
        return L'\0';
      }
      if ((int)borg_t - (int)borg_t_morgoth < 0xb) {
        return L'\0';
      }
      if (track_step.num == 0) {
        return L'\0';
      }
    }
    switch(uVar33) {
    case 2:
switchD_002146fe_caseD_2:
      _Var10 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\x02',borg.c.x);
      if ((_Var10) && (track_step.y[(long)track_step.num + -1] != borg.c.y + 1)) {
        borg_keypress(0x4c);
        k = 0x32;
        goto LAB_00215594;
      }
      if (uVar33 != 6) {
        if (uVar33 != 4) {
          return L'\0';
        }
        goto switchD_002146fe_caseD_4;
      }
      break;
    case 4:
switchD_002146fe_caseD_4:
      _Var10 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\xfffffffe');
      if ((_Var10) && (track_step.x[(long)track_step.num + -1] != borg.c.x + -1)) {
        borg_keypress(0x4c);
        k = 0x34;
        goto LAB_00215594;
      }
      if (uVar33 != 6) {
        return L'\0';
      }
      break;
    case 6:
      break;
    case 8:
      _Var10 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\xfffffffe',borg.c.x);
      if ((_Var10) && (track_step.y[(long)track_step.num + -1] != borg.c.y + -1)) {
        borg_keypress(0x4c);
        k = 0x38;
        goto LAB_00215594;
      }
      if (uVar33 != 6) {
        if (uVar33 != 4) {
          if (uVar33 != 2) {
            return L'\0';
          }
          goto switchD_002146fe_caseD_2;
        }
        goto switchD_002146fe_caseD_4;
      }
      break;
    default:
      return L'\0';
    }
    _Var10 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\x02');
    if (!_Var10) {
      return L'\0';
    }
    if (track_step.x[(long)track_step.num + -1] == borg.c.x + 1) {
      return L'\0';
    }
    borg_keypress(0x4c);
    k = 0x36;
LAB_00215594:
    borg_keypress(k);
    borg_note("# Shifted panel as a precaution.");
    borg.when_shift_panel = borg_t;
    borg_keypress(0xe000);
    return L'\0';
  case L'\x1c':
    if ((((borg_morgoth_position) || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))) &&
        ((morgoth_on_level || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))))) &&
       ((borg.trait[0x69] != 0 && (_Var10 = borg_spell_okay_fail(TELEPORT_OTHER,L'\x1e'), !_Var10)))
       ) {
      if (1 < borg_kills_nxt) {
        lVar28 = 1;
        lVar32 = 0x1d8;
        do {
          pbVar6 = borg_kills;
          bVar35 = false;
          if (*(short *)(borg_kills->spell + lVar32 + -0x19) != 0) {
            uVar33 = *(wchar_t *)(borg_kills->spell + lVar32 + -0xd) - borg.c.x;
            uVar31 = -uVar33;
            if (0 < (int)uVar33) {
              uVar31 = uVar33;
            }
            uVar34 = *(wchar_t *)(borg_kills->spell + lVar32 + -9) - borg.c.y;
            uVar33 = -uVar34;
            if (0 < (int)uVar34) {
              uVar33 = uVar34;
            }
            if ((int)uVar33 < (int)uVar31) {
              uVar33 = uVar31;
            }
            if (uVar33 <= z_info->max_range) {
              _Var10 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar32 + -9),
                                *(wchar_t *)(borg_kills->spell + lVar32 + -0xd));
              if ((_Var10) &&
                 (((borg_morgoth_id == *(ushort *)(pbVar6->spell + lVar32 + -0x19) ||
                   (pbVar6->spell[lVar32 + -1] != '\0')) && ((int)avoidance <= borg.trait[0x1b]))))
              {
                borg_note("# Not resting. I can see Morgoth or a shooter.");
                bVar35 = true;
              }
              else {
                bVar35 = false;
              }
            }
          }
          if (bVar35) {
            return L'\0';
          }
          lVar28 = lVar28 + 1;
          lVar32 = lVar32 + 0x1d8;
        } while (lVar28 < borg_kills_nxt);
      }
      if (borg_simulate != false) {
        return L'È';
      }
      borg_keypress(0x2c);
      pcVar21 = format("# Resting on grid (%d, %d), waiting for Morgoth.",(ulong)(uint)borg.c.y,
                       (ulong)(uint)borg.c.x);
      borg_note(pcVar21);
      return L'È';
    }
    break;
  case L'\x1d':
    if (((((borg.trait[0x69] == 100) && (morgoth_on_level)) &&
         ((borg.trait[0x70] == 0 && ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))))) &&
        (_Var10 = borg_spell_okay_fail(TELEPORT_OTHER,L'('), _Var10)) &&
       ((9 < borg.trait[0xe6] && (_Var10 = borg_surrounded(), !_Var10)))) {
      if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
        return L'\0';
      }
      borg_temp_n = 0;
      borg_tp_other_n = 0;
      if (0 < borg_kills_nxt) {
        lVar28 = 0;
        lVar32 = 0;
        do {
          pbVar6 = borg_kills;
          if ((((*(short *)(borg_kills->spell + lVar28 + -0x19) != 0) &&
               (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar28))) &&
              ((~borg_grids[*(int *)(borg_kills->spell + lVar28 + -9)]
                 [*(int *)(borg_kills->spell + lVar28 + -0xd)].info & 0x28) == 0)) &&
             ((grid1_05.y = borg.c.y, grid1_05.x = borg.c.x,
              wVar17 = distance(grid1_05,*(loc_conflict *)(borg_kills->spell + lVar28 + -0xd)),
              wVar17 <= (int)(uint)z_info->max_range &&
              (_Var10 = borg_projectable(borg.c.y,borg.c.x,*(wchar_t *)(pbVar6->spell + lVar28 + -9)
                                         ,*(wchar_t *)(pbVar6->spell + lVar28 + -0xd)), _Var10)))) {
            borg_temp_x[borg_temp_n] = pbVar6->spell[lVar28 + -0xd];
            borg_temp_y[borg_temp_n] = pbVar6->spell[lVar28 + -9];
            borg_temp_n = borg_temp_n + 1;
          }
          lVar32 = lVar32 + 1;
          lVar28 = lVar28 + 0x1d8;
        } while (lVar32 < borg_kills_nxt);
      }
      if ((borg_temp_n != 0) || (borg_simulate == false)) {
        _Var10 = false;
        wVar18 = borg_launch_bolt(L'\0',L'2',L'.',(uint)z_info->max_range,L'\0');
        wVar17 = L'Ϩ';
        if (wVar18 < L'Ϩ') {
          wVar17 = wVar18;
        }
        borg_temp_n = 0;
        borg_tp_other_n = 0;
        if (borg_simulate != false) {
          borg_tp_other_n = 0;
          borg_temp_n = 0;
          return wVar17;
        }
        borg_log_spellpath(_Var10);
        uVar19 = (ulong)(ushort)borg_tp_other_n;
        if (0 < borg_tp_other_n) {
          lVar28 = 0;
          do {
            pcVar21 = format("# %d, index %d (%d,%d)",(ulong)(uint)(int)(short)uVar19,
                             (ulong)(uint)borg_tp_other_index[lVar28],(ulong)borg_tp_other_y[lVar28]
                             ,(ulong)borg_tp_other_x[lVar28]);
            borg_note(pcVar21);
            lVar28 = lVar28 + 1;
            uVar19 = (ulong)borg_tp_other_n;
          } while (lVar28 < (long)uVar19);
        }
        borg_note("# Attempting to cast T.O. for depth 100.");
        _Var10 = borg_spell(TELEPORT_OTHER);
        if (((_Var10) || (_Var10 = borg_activate_item(act_tele_other), _Var10)) ||
           (_Var10 = borg_aim_wand(sv_wand_teleport_away), _Var10)) {
          borg_keypress(0x35);
          successful_target = L'\xffffffff';
          return wVar17;
        }
      }
    }
    break;
  case L'\x1e':
    if (((morgoth_on_level) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      _Var10 = borg_spell_okay_fail(BANISH_EVIL,L'2');
      _Var11 = borg_spell_okay_fail(MASS_BANISHMENT,L'2');
      if (_Var11 || _Var10) {
        if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
          return L'\0';
        }
        local_c68 = 0;
        if (1 < borg_kills_nxt) {
          local_c68 = 0;
          lVar28 = 1;
          lVar32 = 0x1d8;
          do {
            pbVar6 = borg_kills;
            uVar1 = *(ushort *)(borg_kills->spell + lVar32 + -0x19);
            if (((((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
                 (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar32))) &&
                ((_Var11 || !_Var10 ||
                 (_Var12 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL")
                 , _Var12)))) &&
               ((grid1_03.y = borg.c.y, grid1_03.x = borg.c.x,
                wVar17 = distance(grid1_03,*(loc_conflict *)(pbVar6->spell + lVar32 + -0xd)),
                wVar17 <= (int)(uint)z_info->max_range &&
                (_Var12 = borg_projectable(borg.c.y,borg.c.x,
                                           *(wchar_t *)(pbVar6->spell + lVar32 + -9),
                                           *(wchar_t *)(pbVar6->spell + lVar32 + -0xd)), _Var12))))
            {
              grid1_04.y = borg.c.y;
              grid1_04.x = borg.c.x;
              wVar17 = distance(grid1_04,*(loc_conflict *)(pbVar6->spell + lVar32 + -0xd));
              local_c68 = (ulong)((int)local_c68 + (uint)(wVar17 < L'\b') + 1);
            }
            lVar28 = lVar28 + 1;
            lVar32 = lVar32 + 0x1d8;
          } while (lVar28 < borg_kills_nxt);
        }
        if ((7 < (int)local_c68) || (borg_simulate == false)) {
          if (borg_simulate != false) {
            return L'ל';
          }
          pcVar21 = format("# Attempting to cast Banishment for depth 100.  %d monsters ",local_c68)
          ;
          borg_note(pcVar21);
          _Var10 = borg_spell(MASS_BANISHMENT);
          if ((!_Var10) && (_Var10 = borg_spell(BANISH_EVIL), !_Var10)) {
            return L'\0';
          }
          if (borg_kills_nxt < 1) {
            return L'Ϩ';
          }
          lVar28 = 0;
          lVar32 = 0;
          do {
            uVar1 = *(ushort *)(borg_kills->spell + lVar28 + -0x19);
            if (((uVar1 != 0) && ((int)(uint)uVar1 < (int)(z_info->r_max - 1))) &&
               (_Var10 = flag_has_dbg(r_info[(uint)uVar1].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"
                                     ), !_Var10)) {
              borg_delete_kill((wchar_t)lVar32);
            }
            lVar32 = lVar32 + 1;
            lVar28 = lVar28 + 0x1d8;
          } while (lVar32 < borg_kills_nxt);
          return L'Ϩ';
        }
      }
    }
    break;
  case L'\x1f':
    if ((((((borg_morgoth_position) && (morgoth_on_level)) && (borg.trait[0x70] == 0)) &&
         ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) &&
        ((_Var10 = borg_spell_okay_fail(SPEAR_OF_LIGHT,L'2'), _Var10 ||
         ((_Var10 = borg_spell_okay_fail(CLAIRVOYANCE,L'2'), _Var10 ||
          (_Var10 = borg_spell_okay_fail(FUME_OF_MORDOR,L'2'), _Var10)))))) &&
       ((local_c60 = (_Bool *)&borg_kills_cnt, borg_kills_cnt != 0 ||
        (local_c60 = &borg_simulate, borg_simulate == false)))) {
      if (borg_kills_nxt < 2) {
        bVar35 = true;
        local_c60 = (_Bool *)puVar25;
      }
      else {
        iVar30 = 0;
        lVar28 = 1;
        lVar32 = 0x1d8;
        do {
          pbVar6 = borg_kills;
          if (((*(ushort *)(borg_kills->spell + lVar32 + -0x19) != 0) &&
              (borg_morgoth_id == *(ushort *)(borg_kills->spell + lVar32 + -0x19))) &&
             (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar32))) {
            wVar17 = *(wchar_t *)(borg_kills->spell + lVar32 + -0xd);
            wVar18 = *(wchar_t *)(borg_kills->spell + lVar32 + -9);
            grid1_00.y = borg.c.y;
            grid1_00.x = borg.c.x;
            wVar16 = distance(grid1_00,*(loc_conflict *)(borg_kills->spell + lVar32 + -0xd));
            if (((wVar16 <= (int)(uint)z_info->max_range) &&
                (grid1_01.y = borg.c.y, grid1_01.x = borg.c.x,
                wVar16 = distance(grid1_01,*(loc_conflict *)(pbVar6->spell + lVar32 + -0xd)),
                L'\x05' < wVar16)) &&
               (_Var10 = borg_projectable_dark(borg.c.y,borg.c.x,wVar18,wVar17), _Var10)) {
              iVar30 = iVar30 + 1;
              local_c60 = (_Bool *)(ulong)(uint)wVar18;
              local_c54 = wVar17;
            }
          }
          lVar28 = lVar28 + 1;
          lVar32 = lVar32 + 0x1d8;
        } while (lVar28 < borg_kills_nxt);
        bVar35 = iVar30 < 1;
      }
      if ((bVar35) && (borg_simulate != false)) {
        return L'\0';
      }
      if (borg_simulate != false) {
        return L'Ǵ';
      }
      pcVar21 = format("# Attempting to Illuminate a Pathway to (%d, %d)",
                       (ulong)local_c60 & 0xffffffff,(ulong)(uint)local_c54);
      borg_note(pcVar21);
      borg_target((loc_conflict)((ulong)(uint)local_c54 | (long)local_c60 << 0x20));
      _Var10 = borg_spell(SPEAR_OF_LIGHT);
      if (((_Var10) || (_Var10 = borg_spell(CLAIRVOYANCE), _Var10)) ||
         (_Var10 = borg_spell(FUME_OF_MORDOR), _Var10)) {
        borg_keypress(0x35);
        return L'È';
      }
    }
  }
  return L'\0';
}

Assistant:

static int borg_calculate_defense_effectiveness(int what, int p1)
{
    /* Analyze */
    switch (what) {
    case BD_SPEED: {
        return (borg_defend_aux_speed(p1));
    }
    case BD_PROT_FROM_EVIL: {
        return (borg_defend_aux_prot_evil(p1));
    }
    case BD_GRIM_PURPOSE: {
        return (borg_defend_aux_grim_purpose(p1));
    }
    case BD_RESIST_FECAP: {
        return (borg_defend_aux_resist_fecap(p1));
    }
    case BD_RESIST_F: {
        return (borg_defend_aux_resist_f(p1));
    }
    case BD_RESIST_C: {
        return (borg_defend_aux_resist_c(p1));
    }
    case BD_RESIST_A: {
        return (borg_defend_aux_resist_a(p1));
    }
    case BD_RESIST_E: {
        return (borg_defend_aux_resist_e(p1));
    }
    case BD_RESIST_P: {
        return (borg_defend_aux_resist_p(p1));
    }
    case BD_BLESS: {
        return (borg_defend_aux_bless(p1));
    }
    case BD_HERO: {
        return (borg_defend_aux_hero(p1));
    }
    case BD_BERSERK: {
        return (borg_defend_aux_berserk(p1));
    }
    case BD_SMITE_EVIL: {
        return (borg_defend_aux_smite_evil(p1));
    }
    case BD_REGEN: {
        return (borg_defend_aux_regen(p1));
    }
    case BD_SHIELD: {
        return (borg_defend_aux_shield(p1));
    }
    case BD_TELE_AWAY: {
        return (borg_defend_aux_tele_away(p1));
    }
    case BD_GLYPH: {
        return (borg_defend_aux_glyph(p1));
    }
    case BD_CREATE_DOOR: {
        return (borg_defend_aux_create_door(p1));
    }
    case BD_MASS_GENOCIDE: {
        return (borg_defend_aux_mass_genocide(p1));
    }
    case BD_GENOCIDE: {
        return (borg_defend_aux_genocide(p1));
    }
    case BD_GENOCIDE_NASTIES: {
        return (borg_defend_aux_genocide_nasties(p1));
    }
    case BD_EARTHQUAKE: {
        return (borg_defend_aux_earthquake(p1));
    }
    case BD_TPORTLEVEL: {
        return (borg_defend_aux_teleportlevel(p1));
    }
    case BD_DESTRUCTION: {
        return (borg_defend_aux_destruction(p1));
    }
    case BD_BANISHMENT: {
        return (borg_defend_aux_banishment(p1));
    }
    case BD_DETECT_INVISO: {
        return (borg_defend_aux_inviso(p1));
    }
    case BD_LIGHT_BEAM: {
        return (borg_defend_aux_lbeam(p1));
    }
    case BD_SHIFT_PANEL: {
        return (borg_defend_aux_panel_shift());
    }
    case BD_REST: {
        return (borg_defend_aux_rest());
    }
    case BD_TELE_AWAY_MORGOTH: {
        return (borg_defend_aux_tele_away_morgoth());
    }
    case BD_BANISHMENT_MORGOTH: {
        return (borg_defend_aux_banishment_morgoth());
    }
    case BD_LIGHT_MORGOTH: {
        return (borg_defend_aux_light_morgoth());
    }
    }
    return 0;
}